

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_api.cpp
# Opt level: O0

void __thiscall
cppcms::impl::cgi::http::http
          (http *this,service *srv,string *ip,int port,
          shared_ptr<cppcms::impl::cgi::http_watchdog> *wd,
          shared_ptr<cppcms::impl::url_rewriter> *rw)

{
  io_service *piVar1;
  cached_settings *pcVar2;
  undefined4 in_ECX;
  string *in_RDX;
  long *in_RDI;
  shared_ptr<cppcms::impl::cgi::http_watchdog> *in_stack_ffffffffffffff48;
  shared_ptr<cppcms::impl::cgi::http_watchdog> *in_stack_ffffffffffffff50;
  uint *in_stack_ffffffffffffff70;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  parser *this_00;
  service *in_stack_ffffffffffffff88;
  connection *in_stack_ffffffffffffff90;
  
  connection::connection(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  *in_RDI = (long)&PTR__http_00530c38;
  cppcms::service::impl((service *)0x497425);
  piVar1 = service::get_io_service((service *)0x497436);
  booster::aio::stream_socket::stream_socket((stream_socket *)(in_RDI + 0x20),piVar1);
  this_00 = (parser *)(in_RDI + 0x26);
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x497464);
  *(undefined4 *)(in_RDI + 0x29) = 0;
  cppcms::http::impl::parser::parser(this_00,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  std::__cxx11::string::string((string *)(in_RDI + 0x3e));
  *(undefined1 *)((long)in_RDI + 0x264) = 0;
  *(undefined1 *)((long)in_RDI + 0x265) = 0;
  *(undefined1 *)((long)in_RDI + 0x266) = 0;
  std::__cxx11::string::string((string *)(in_RDI + 0x50));
  std::shared_ptr<cppcms::impl::cgi::http_watchdog>::shared_ptr
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  std::shared_ptr<cppcms::impl::url_rewriter>::shared_ptr
            ((shared_ptr<cppcms::impl::url_rewriter> *)in_stack_ffffffffffffff50,
             (shared_ptr<cppcms::impl::url_rewriter> *)in_stack_ffffffffffffff48);
  std::__cxx11::string::string((string *)(in_RDI + 0x58),in_RDX);
  std::__cxx11::string::string((string *)(in_RDI + 0x5c));
  *(undefined4 *)(in_RDI + 0x60) = in_ECX;
  pcVar2 = cppcms::service::cached_settings((service *)0x497560);
  *(int *)(in_RDI + 0x4c) = (pcVar2->http).timeout;
  (**(code **)(*in_RDI + 0x68))();
  return;
}

Assistant:

http(	cppcms::service &srv,
			std::string const &ip,
			int port,
			booster::shared_ptr<http_watchdog> wd,
			booster::shared_ptr<url_rewriter> rw
			) 
		:
			connection(srv),
			socket_(srv.impl().get_io_service()),
			input_body_ptr_(0),
			input_parser_(input_body_,input_body_ptr_),
			sync_option_is_set_(false),
			in_watchdog_(false),
			eof_callback_(false),
			watchdog_(wd),
			rewrite_(rw),
			ip_(ip),
			port_(port)
		{
			timeout_ = srv.cached_settings().http.timeout;
			reset_all();
		}